

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O1

void __thiscall Bmp::save(Bmp *this,string *file)

{
  bool bVar1;
  FILE *__s;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  __s = fopen((file->_M_dataplus)._M_p,"wb");
  fwrite(&this->m_bf,1,0xe,__s);
  fwrite(&this->m_bi,1,0x28,__s);
  lVar4 = (long)this->m_h;
  if (0 < (long)this->m_h) {
    do {
      lVar5 = lVar4 + -1;
      if (0 < this->m_w) {
        lVar3 = 0;
        do {
          fputc((int)(char)this->m_data[lVar3][lVar5].b,__s);
          fputc((int)(char)this->m_data[lVar3][lVar5].g,__s);
          fputc((int)(char)this->m_data[lVar3][lVar5].r,__s);
          lVar3 = lVar3 + 1;
        } while (lVar3 < this->m_w);
      }
      if (0 < (int)(this->m_w & 0x80000003U)) {
        iVar2 = 0;
        do {
          fputc(0,__s);
          iVar2 = iVar2 + 1;
        } while (iVar2 < this->m_w % 4);
      }
      bVar1 = 1 < lVar4;
      lVar4 = lVar5;
    } while (bVar1);
  }
  fclose(__s);
  return;
}

Assistant:

void Bmp::save(const std::string& file) const
{
    FILE* f = fopen(file.c_str(), "wb");

    fwrite(&m_bf, 1, sizeof(BITMAPFILEHEADER), f);
    fwrite(&m_bi, 1, sizeof(BITMAPINFOHEADER), f);
    for (int j = m_h - 1; j >= 0; j--)
    {
        for (int i = 0; i < m_w; i++)
        {
            fwrite(&m_data[i][j].b, 1, sizeof(byte), f);
            fwrite(&m_data[i][j].g, 1, sizeof(byte), f);
            fwrite(&m_data[i][j].r, 1, sizeof(byte), f);
        }
        for (int i = 0; i < m_w % 4; i++) fputc(0, f);
    }

    fclose(f);
}